

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::
TypedExpectation<void_(solitaire::graphics::TextureId,_const_solitaire::geometry::Position_&,_const_solitaire::geometry::Area_&)>
::TypedExpectation(TypedExpectation<void_(solitaire::graphics::TextureId,_const_solitaire::geometry::Position_&,_const_solitaire::geometry::Area_&)>
                   *this,FunctionMocker<void_(solitaire::graphics::TextureId,_const_solitaire::geometry::Position_&,_const_solitaire::geometry::Area_&)>
                         *owner,char *a_file,int a_line,string *a_source_text,
                  ArgumentMatcherTuple *m)

{
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_002f74b8;
  this->owner_ = owner;
  std::
  _Tuple_impl<0UL,_testing::Matcher<solitaire::graphics::TextureId>,_testing::Matcher<const_solitaire::geometry::Position_&>,_testing::Matcher<const_solitaire::geometry::Area_&>_>
  ::_Tuple_impl(&(this->matchers_).
                 super__Tuple_impl<0UL,_testing::Matcher<solitaire::graphics::TextureId>,_testing::Matcher<const_solitaire::geometry::Position_&>,_testing::Matcher<const_solitaire::geometry::Area_&>_>
                ,&m->
                  super__Tuple_impl<0UL,_testing::Matcher<solitaire::graphics::TextureId>,_testing::Matcher<const_solitaire::geometry::Position_&>,_testing::Matcher<const_solitaire::geometry::Area_&>_>
               );
  (this->extra_matcher_).
  super_MatcherBase<const_std::tuple<solitaire::graphics::TextureId,_const_solitaire::geometry::Position_&,_const_solitaire::geometry::Area_&>_&>
  .vtable_ = (VTable *)
             MatcherBase<std::tuple<solitaire::graphics::TextureId,solitaire::geometry::Position_const&,solitaire::geometry::Area_const&>const&>
             ::
             GetVTable<testing::internal::MatcherBase<std::tuple<solitaire::graphics::TextureId,solitaire::geometry::Position_const&,solitaire::geometry::Area_const&>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
             ::kVTable;
  (this->extra_matcher_).
  super_MatcherBase<const_std::tuple<solitaire::graphics::TextureId,_const_solitaire::geometry::Position_&,_const_solitaire::geometry::Area_&>_&>
  .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002f7500;
  *(undefined8 *)&(this->repeated_action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->repeated_action_).fun_.super__Function_base._M_functor + 8) = 0;
  (this->repeated_action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->repeated_action_).fun_._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

TypedExpectation(FunctionMocker<F>* owner, const char* a_file, int a_line,
                   const std::string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that causes ambiguity between
        // Matcher's copy and move constructor for some argument types.
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}